

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

void mp::WriteVar<fmt::BasicMemoryWriter<char,std::allocator<char>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *pr,char *name,double lb,double ub,
               Type ty)

{
  BasicWriter<char> *pBVar1;
  size_t sVar2;
  char *pcVar3;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  BasicStringRef<char> value_03;
  BasicStringRef<char> value_04;
  size_t sStack_50;
  
  value.size_ = 4;
  value.data_ = "var ";
  pBVar1 = fmt::BasicWriter<char>::operator<<(&pr->super_BasicWriter<char>,value);
  sVar2 = strlen(name);
  value_00.size_ = sVar2;
  value_00.data_ = name;
  fmt::BasicWriter<char>::operator<<(pBVar1,value_00);
  if (ty == INTEGER && (lb == 0.0 && ub == 1.0)) {
    pcVar3 = " binary";
    sStack_50 = 7;
  }
  else {
    if ((lb == ub) && (!NAN(lb) && !NAN(ub))) {
      value_02.size_ = 3;
      value_02.data_ = " = ";
      pBVar1 = fmt::BasicWriter<char>::operator<<(&pr->super_BasicWriter<char>,value_02);
      fmt::BasicWriter<char>::operator<<(pBVar1,lb);
      return;
    }
    if (-1.79769313486232e+308 < lb) {
      value_03.size_ = 3;
      value_03.data_ = " >=";
      pBVar1 = fmt::BasicWriter<char>::operator<<(&pr->super_BasicWriter<char>,value_03);
      fmt::BasicWriter<char>::operator<<(pBVar1,lb);
    }
    if (ub < 1.79769313486232e+308) {
      value_04.size_ = 3;
      value_04.data_ = " <=";
      pBVar1 = fmt::BasicWriter<char>::operator<<(&pr->super_BasicWriter<char>,value_04);
      fmt::BasicWriter<char>::operator<<(pBVar1,ub);
    }
    if (ty != INTEGER) {
      return;
    }
    pcVar3 = " integer";
    sStack_50 = 8;
  }
  value_01.size_ = sStack_50;
  value_01.data_ = pcVar3;
  fmt::BasicWriter<char>::operator<<(&pr->super_BasicWriter<char>,value_01);
  return;
}

Assistant:

void WriteVar(Writer& pr, const char* name,
              double lb, double ub, var::Type ty) {
  assert(*name);
  pr << "var " << name;
  if (!lb && 1.0==ub && var::INTEGER==ty)
    pr << " binary";
  else if (lb==ub)
    pr << " = " << lb;
  else {
    if (lb > -DBL_MAX)
    pr << " >=" << lb;
    if (ub < DBL_MAX)
    pr << " <=" << ub;
    if (var::INTEGER == ty)
    pr << " integer";
  }
}